

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O2

bool __thiscall
Costs::pruningTest(Costs *this,double r,double s,uint tau,uint t,uint n,double S,double Ap,double Am
                  ,double Gp,double Gm)

{
  double dVar1;
  double state1;
  double dVar2;
  
  if (t != n && r != s) {
    dVar2 = (s + s + r) / 6.0;
    dVar1 = (double)tau * dVar2 + (s - r) / ((double)(t - tau) * -12.0) + S / (double)(t - tau);
    if (s <= r) {
      dVar1 = dVar1 + Gm;
      if (0.0 <= (double)(t + 1) * (Am - dVar2) + dVar1) {
        return false;
      }
      if (0.0 <= (Am - dVar2) * (double)n + dVar1) {
        return false;
      }
    }
    else {
      dVar1 = dVar1 + Gp;
      if (((double)(t + 1) * (Ap - dVar2) + dVar1 <= 0.0) ||
         ((Ap - dVar2) * (double)n + dVar1 <= 0.0)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Costs::pruningTest(double r, double s, unsigned int tau, unsigned int t, unsigned int n, double S, double Ap, double Am, double Gp, double Gm)
{
  bool response = false;

  if(r == s || t == n){response = true;}
  else if(s > r)
  {
    double state1 = (r+2*s)/6.0;
    double tempGp = tau*state1 - (s-r)/(12.0*(t-tau)) + S/(1.0*(t-tau)) + Gp;
    double ApC = Ap - state1;
    if((ApC*(t+1) + tempGp > 0) && (ApC*n + tempGp > 0)){response = true;}
  }
  else /// s < r
  {
    double state2 = (r+2*s)/6.0;
    double tempGm = tau*state2 - (s-r)/(12.0*(t-tau)) + S/(1.0*(t-tau)) + Gm;
    double AmC = Am - state2;
    if((AmC*(t+1) + tempGm < 0) && (AmC*n + tempGm < 0)){response = true;}
  }

  //response = false; /// TO REMOVE
  return(response);
}